

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRBMemoryAllocator.cpp
# Opt level: O2

void __thiscall
Diligent::SRBMemoryAllocator::Initialize
          (SRBMemoryAllocator *this,Uint32 SRBAllocationGranularity,
          Uint32 ShaderVariableDataAllocatorCount,size_t *ShaderVariableDataSizes,
          Uint32 ResourceCacheDataAllocatorCount,size_t *ResourceCacheDataSizes)

{
  size_t BlockSize;
  FixedBlockMemoryAllocator *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t *psVar3;
  IMemoryAllocator *RawMemoryAllocator;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  string msg;
  
  if (SRBAllocationGranularity < 2) {
    FormatString<char[26],char[29]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"SRBAllocationGranularity > 1",(char (*) [29])ShaderVariableDataSizes)
    ;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/SRBMemoryAllocator.cpp"
               ,0x34);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (((this->m_DataAllocators != (FixedBlockMemoryAllocator *)0x0) ||
      (this->m_ShaderVariableDataAllocatorCount != 0)) ||
     (this->m_ResourceCacheDataAllocatorCount != 0)) {
    FormatString<char[33]>(&msg,(char (*) [33])"Allocator is already initialized");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/SRBMemoryAllocator.cpp"
               ,0x35);
    std::__cxx11::string::~string((string *)&msg);
  }
  this->m_ShaderVariableDataAllocatorCount = ShaderVariableDataAllocatorCount;
  this->m_ResourceCacheDataAllocatorCount = ResourceCacheDataAllocatorCount;
  uVar6 = ResourceCacheDataAllocatorCount + ShaderVariableDataAllocatorCount;
  if (uVar6 != 0) {
    iVar2 = (**this->m_RawMemAllocator->_vptr_IMemoryAllocator)
                      (this->m_RawMemAllocator,(ulong)uVar6 * 0x130,
                       "Raw memory for SRBMemoryAllocator::m_ShaderVariableDataAllocators",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/SRBMemoryAllocator.cpp"
                       ,0x41);
    this->m_DataAllocators = (FixedBlockMemoryAllocator *)CONCAT44(extraout_var,iVar2);
    lVar5 = 0;
    for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      psVar3 = ResourceCacheDataSizes + ((int)uVar4 - ShaderVariableDataAllocatorCount);
      if (uVar4 < ShaderVariableDataAllocatorCount) {
        psVar3 = ShaderVariableDataSizes;
      }
      BlockSize = *psVar3;
      pFVar1 = this->m_DataAllocators;
      RawMemoryAllocator = GetRawAllocator();
      FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
                ((FixedBlockMemoryAllocator *)
                 ((long)&(pFVar1->super_IMemoryAllocator)._vptr_IMemoryAllocator + lVar5),
                 RawMemoryAllocator,BlockSize,SRBAllocationGranularity);
      ShaderVariableDataSizes = ShaderVariableDataSizes + 1;
      lVar5 = lVar5 + 0x130;
    }
  }
  return;
}

Assistant:

void SRBMemoryAllocator::Initialize(Uint32              SRBAllocationGranularity,
                                    Uint32              ShaderVariableDataAllocatorCount,
                                    const size_t* const ShaderVariableDataSizes,
                                    Uint32              ResourceCacheDataAllocatorCount,
                                    const size_t* const ResourceCacheDataSizes)
{
    VERIFY_EXPR(SRBAllocationGranularity > 1);
    VERIFY(m_DataAllocators == nullptr && m_ShaderVariableDataAllocatorCount == 0 && m_ResourceCacheDataAllocatorCount == 0, "Allocator is already initialized");

    m_ShaderVariableDataAllocatorCount = ShaderVariableDataAllocatorCount;
    m_ResourceCacheDataAllocatorCount  = ResourceCacheDataAllocatorCount;
    auto TotalAllocatorCount           = m_ShaderVariableDataAllocatorCount + m_ResourceCacheDataAllocatorCount;

    if (TotalAllocatorCount == 0)
        return;

    auto* pAllocatorsRawMem = m_RawMemAllocator.Allocate(
        sizeof(FixedBlockMemoryAllocator) * TotalAllocatorCount,
        "Raw memory for SRBMemoryAllocator::m_ShaderVariableDataAllocators",
        __FILE__, __LINE__);
    m_DataAllocators = reinterpret_cast<FixedBlockMemoryAllocator*>(pAllocatorsRawMem);

    for (Uint32 s = 0; s < TotalAllocatorCount; ++s)
    {
        auto size = s < ShaderVariableDataAllocatorCount ? ShaderVariableDataSizes[s] : ResourceCacheDataSizes[s - ShaderVariableDataAllocatorCount];
        new (m_DataAllocators + s) FixedBlockMemoryAllocator(GetRawAllocator(), size, SRBAllocationGranularity);
    }
}